

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_extern_t::wasm_extern_t(wasm_extern_t *this,RefPtr<wabt::interp::Extern> *ptr)

{
  RefPtr<wabt::interp::Object> RStack_28;
  
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Extern>(&RStack_28,ptr);
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
            ((RefPtr<wabt::interp::Object> *)this,&RStack_28);
  wabt::interp::RefPtr<wabt::interp::Object>::reset(&RStack_28);
  return;
}

Assistant:

wasm_extern_t(RefPtr<Extern> ptr) : wasm_ref_t(ptr) {}